

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall google::protobuf::ArenaTest_Alignment_Test::TestBody(ArenaTest_Alignment_Test *this)

{
  void *v;
  Nonnull<const_char_*> failure_msg;
  LogMessage *this_00;
  int iVar1;
  string_view str;
  Arena arena;
  LogMessage LStack_d8;
  int local_c4;
  ThreadSafeArena local_c0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_c0);
  iVar1 = 0;
  do {
    v = Arena::AllocateForArray((Arena *)&local_c0,(ulong)(iVar1 + 7U & 0x1f8));
    if (((ulong)v & 7) != 0) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                              ((ulong)v & 7,0,"reinterpret_cast<uintptr_t>(p) % 8 == 0u");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
                 ,0x6cd,failure_msg);
      local_c4 = iVar1;
      this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                          (&LStack_d8,&local_c4);
      str._M_str = ": ";
      str._M_len = 2;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
      absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_d8);
    }
    iVar1 = iVar1 + 1;
  } while (iVar1 != 200);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_c0);
  return;
}

Assistant:

TEST(ArenaTest, Alignment) {
  Arena arena;
  for (int i = 0; i < 200; i++) {
    void* p = Arena::CreateArray<char>(&arena, i);
    ABSL_CHECK_EQ(reinterpret_cast<uintptr_t>(p) % 8, 0u) << i << ": " << p;
  }
}